

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_tiledesc(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  uint64_t *puVar1;
  exr_result_t eVar2;
  int32_t isz;
  anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 local_28;
  undefined4 local_1c;
  
  local_28 = (((a->field_6).box2i)->min).field_0;
  local_1c = 9;
  puVar1 = &ctxt->output_file_offset;
  eVar2 = (*ctxt->do_write)(ctxt,&local_1c,4,puVar1);
  if (eVar2 == 0) {
    eVar2 = (*ctxt->do_write)(ctxt,&local_28,8,puVar1);
    if (eVar2 == 0) {
      eVar2 = (*ctxt->do_write)(ctxt,&((a->field_6).box2i)->max,1,puVar1);
    }
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_tiledesc (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    uint32_t     sizes[2];

    sizes[0] = a->tiledesc->x_size;
    sizes[1] = a->tiledesc->y_size;

    rv = save_attr_sz (ctxt, sizeof (uint32_t) * 2 + 1);

    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, sizes, 2);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt,
            &(a->tiledesc->level_and_round),
            sizeof (uint8_t),
            &(ctxt->output_file_offset));
    return rv;
}